

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O1

void __thiscall extract_all::extractfs(extract_all *this,string *name,FileContainer_ptr *fs)

{
  pointer pcVar1;
  element_type *peVar2;
  long *plVar3;
  size_type *psVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string fssavepath;
  undefined1 local_a0 [24];
  _Alloc_hider local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  function<void(std::__cxx11::string_const&)> local_48 [16];
  code *local_38;
  
  pcVar1 = (this->_dstpath)._M_dataplus._M_p;
  local_a0._0_8_ = (extract_all *)(local_a0 + 0x10);
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_a0,pcVar1,pcVar1 + (this->_dstpath)._M_string_length);
  std::__cxx11::string::append((char *)local_a0);
  plVar3 = (long *)std::__cxx11::string::_M_append(local_a0,(ulong)(name->_M_dataplus)._M_p);
  psVar4 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4) {
    local_68.field_2._M_allocated_capacity = *psVar4;
    local_68.field_2._8_8_ = plVar3[3];
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  }
  else {
    local_68.field_2._M_allocated_capacity = *psVar4;
    local_68._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_68._M_string_length = plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if ((extract_all *)local_a0._0_8_ != (extract_all *)(local_a0 + 0x10)) {
    operator_delete((void *)local_a0._0_8_,(ulong)((long)(_func_int ***)local_a0._16_8_ + 1));
  }
  CreateDirPath<char>(&local_68);
  peVar2 = (fs->super___shared_ptr<FileContainer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_a0._16_8_ =
       (fs->super___shared_ptr<FileContainer,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._16_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._16_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._16_8_)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._16_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._16_8_)->_M_use_count + 1;
    }
  }
  local_a0._0_8_ = this;
  local_a0._8_8_ = peVar2;
  local_88._M_p = (pointer)&local_78;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_88,local_68._M_dataplus._M_p,
             local_68._M_dataplus._M_p + local_68._M_string_length);
  std::function<void(std::__cxx11::string_const&)>::
  function<extract_all::extractfs(std::__cxx11::string_const&,std::shared_ptr<FileContainer>)::_lambda(std::__cxx11::string_const&)_1_,void>
            (local_48,(anon_class_56_3_659c12bf *)local_a0);
  (*peVar2->_vptr_FileContainer[10])(peVar2,local_48);
  if (local_38 != (code *)0x0) {
    (*local_38)(local_48,local_48,3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_p != &local_78) {
    operator_delete(local_88._M_p,local_78._M_allocated_capacity + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._16_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._16_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void extractfs(const std::string& name, FileContainer_ptr fs)
    {
        std::string fssavepath= _dstpath+"/"+name;
        CreateDirPath(fssavepath);
        fs->filename_enumerator(
            [this,fs,fssavepath](const std::string& romname) {
                try {
                    fs->extractfile(romname, fssavepath+"/"+romname, _filter);
                }
                catch(const char*msg)
                {
                    printf("extractfile: %s: %s\n", romname.c_str(), msg);
                }
            }
        );

    }